

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

Datatype * __thiscall TypeOpCall::getInputLocal(TypeOpCall *this,PcodeOp *op,int4 slot)

{
  uintb uVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  Datatype *pDVar5;
  pointer ppVVar6;
  Varnode *pVVar7;
  
  ppVVar6 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar7 = *ppVVar6;
  if (slot != 0) {
    if (((pVVar7->loc).base)->type == IPTR_FSPEC) {
      uVar1 = (pVVar7->loc).offset;
      iVar3 = (**(code **)(**(long **)(uVar1 + 8) + 0x28))();
      if ((iVar3 == (int)((ulong)((long)(op->inrefs).
                                        super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(op->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3) + -1) ||
         ((*(byte *)(uVar1 + 0x14) & 1) != 0)) {
        plVar4 = (long *)(**(code **)(**(long **)(uVar1 + 8) + 0x30))
                                   (*(long **)(uVar1 + 8),slot + -1);
        if (plVar4 != (long *)0x0) {
          cVar2 = (**(code **)(*plVar4 + 0x30))(plVar4);
          if (cVar2 != '\0') {
            pDVar5 = (Datatype *)(**(code **)(*plVar4 + 0x18))(plVar4);
            if ((pDVar5->metatype != TYPE_VOID) &&
               (pDVar5->size <=
                (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start[slot]->size)) {
              return pDVar5;
            }
          }
        }
      }
      ppVVar6 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start + slot;
    }
    else {
      ppVVar6 = ppVVar6 + slot;
    }
    pVVar7 = *ppVVar6;
  }
  pDVar5 = TypeFactory::getBase((this->super_TypeOp).tlst,pVVar7->size,TYPE_UNKNOWN);
  return pDVar5;
}

Assistant:

Datatype *TypeOpCall::getInputLocal(const PcodeOp *op,int4 slot) const

{
  const FuncCallSpecs *fc;
  const Varnode *vn;
  Datatype *ct;

  vn = op->getIn(0);
  if ((slot==0)||(vn->getSpace()->getType()!=IPTR_FSPEC))// Do we have a prototype to look at
    return TypeOp::getInputLocal(op,slot);
    
  // Get types of call input parameters
  fc = FuncCallSpecs::getFspecFromConst(vn->getAddr());
  // Its false to assume that the parameter symbol corresponds
  // to the varnode in the same slot, but this is easiest until
  // we get giant sized parameters working properly
  if ((fc->numParams() == op->numInput()-1)||(fc->isDotdotdot())) {
    ProtoParameter *param = fc->getParam(slot-1);
    if ((param != (ProtoParameter *)0)&&(param->isTypeLocked())) {
      ct = param->getType();
      if ((ct->getMetatype() != TYPE_VOID)&&
	  (ct->getSize() <= op->getIn(slot)->getSize())) // parameter may not match varnode
	return ct;
    }
  }
  return TypeOp::getInputLocal(op,slot);
}